

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O0

TimingControl *
slang::ast::DelayControl::fromParams
          (Compilation *compilation,ParameterValueAssignmentSyntax *exprs,ASTContext *context)

{
  SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *pSVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  ParamAssignmentSyntax *pPVar5;
  SyntaxNode *this;
  OrderedParamAssignmentSyntax *pOVar6;
  ExpressionSyntax *pEVar7;
  undefined4 extraout_var;
  Compilation *ctrl;
  Type *pTVar8;
  Diagnostic *diag;
  DelayControl *result;
  Expression *local_50;
  Expression *expr;
  DiagCode local_34;
  SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *local_30;
  SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *items;
  ASTContext *context_local;
  ParameterValueAssignmentSyntax *exprs_local;
  Compilation *compilation_local;
  
  local_30 = &exprs->parameters;
  items = (SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *)context;
  context_local = (ASTContext *)exprs;
  exprs_local = (ParameterValueAssignmentSyntax *)compilation;
  sVar4 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::size(local_30);
  if ((sVar4 == 1) &&
     (pPVar5 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::operator[]
                         (local_30,0), (pPVar5->super_SyntaxNode).kind == OrderedParamAssignment)) {
    this = &slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::operator[]
                      (local_30,0)->super_SyntaxNode;
    pOVar6 = slang::syntax::SyntaxNode::as<slang::syntax::OrderedParamAssignmentSyntax>(this);
    pEVar7 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&pOVar6->expr);
    pSVar1 = items;
    bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&result,None);
    iVar3 = Expression::bind((int)pEVar7,(sockaddr *)pSVar1,(socklen_t)result);
    local_50 = (Expression *)CONCAT44(extraout_var,iVar3);
    ctrl = (Compilation *)
           BumpAllocator::
           emplace<slang::ast::DelayControl,slang::ast::Expression_const&,slang::SourceRange_const&>
                     ((BumpAllocator *)exprs_local,local_50,&local_50->sourceRange);
    bVar2 = Expression::bad(local_50);
    if (bVar2) {
      compilation_local =
           (Compilation *)TimingControl::badCtrl((Compilation *)exprs_local,(TimingControl *)ctrl);
    }
    else {
      pTVar8 = not_null<const_slang::ast::Type_*>::operator->(&local_50->type);
      bVar2 = Type::isNumeric(pTVar8);
      compilation_local = ctrl;
      if (!bVar2) {
        diag = ASTContext::addDiag((ASTContext *)items,(DiagCode)0x100008,local_50->sourceRange);
        pTVar8 = not_null<const_slang::ast::Type_*>::operator*(&local_50->type);
        ast::operator<<(diag,pTVar8);
        compilation_local =
             (Compilation *)TimingControl::badCtrl((Compilation *)exprs_local,(TimingControl *)ctrl)
        ;
      }
    }
  }
  else {
    pSVar1 = items;
    local_34.subsystem = Expressions;
    local_34.code = 0x4a;
    _expr = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
    ASTContext::addDiag((ASTContext *)pSVar1,local_34,_expr);
    compilation_local =
         (Compilation *)TimingControl::badCtrl((Compilation *)exprs_local,(TimingControl *)0x0);
  }
  return (TimingControl *)compilation_local;
}

Assistant:

TimingControl& DelayControl::fromParams(Compilation& compilation,
                                        const ParameterValueAssignmentSyntax& exprs,
                                        const ASTContext& context) {
    auto& items = exprs.parameters;
    if (items.size() != 1 || items[0]->kind != SyntaxKind::OrderedParamAssignment) {
        context.addDiag(diag::ExpectedNetDelay, exprs.sourceRange());
        return badCtrl(compilation, nullptr);
    }

    auto& expr = Expression::bind(*items[0]->as<OrderedParamAssignmentSyntax>().expr, context);
    auto result = compilation.emplace<DelayControl>(expr, expr.sourceRange);
    if (expr.bad())
        return badCtrl(compilation, result);

    if (!expr.type->isNumeric()) {
        context.addDiag(diag::DelayNotNumeric, expr.sourceRange) << *expr.type;
        return badCtrl(compilation, result);
    }

    return *result;
}